

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbrz.cpp
# Opt level: O2

void (anonymous_namespace)::Scaler2x<(anonymous_namespace)::ColorGradientRGB>::alphaGrad<5u,6u>
               (uint32_t *pixBack,uint32_t pixFront)

{
  uint uVar1;
  byte bVar2;
  
  bVar2 = (byte)(pixFront >> 8);
  uVar1 = *pixBack;
  *pixBack = ((uVar1 & 0xff) + (pixFront & 0xff) * 5) / 6 +
             (((uVar1 >> 8 & 0xff) + (uint)bVar2 + (uint)bVar2 * 4) / 6 & 0xff) * 0x100 +
             (((uVar1 >> 0x10 & 0xff) + (pixFront >> 0x10 & 0xff) * 5) / 6) * 0x10000;
  return;
}

Assistant:

static void alphaGrad(uint32_t& pixBack, uint32_t pixFront) { ColorGradient::template alphaGrad<M, N>(pixBack, pixFront); }